

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

ImmutableSamplerAttribsType * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetImmutableSamplerAttribs
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,Uint32 SampIndex)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  Uint32 SampIndex_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = SampIndex;
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumImmutableSamplers <= SampIndex) {
    FormatString<char[26],char[46]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SampIndex < this->m_Desc.NumImmutableSamplers",(char (*) [46])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetImmutableSamplerAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x2c9);
    std::__cxx11::string::~string((string *)local_38);
  }
  return this->m_pImmutableSamplerAttribs + (uint)msg.field_2._12_4_;
}

Assistant:

const ImmutableSamplerAttribsType& GetImmutableSamplerAttribs(Uint32 SampIndex) const
    {
        VERIFY_EXPR(SampIndex < this->m_Desc.NumImmutableSamplers);
        return m_pImmutableSamplerAttribs[SampIndex];
    }